

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_substring_after
                 (lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  lyxp_set *set_00;
  ly_bool lVar1;
  LY_ERR ret__;
  LY_ERR LVar2;
  lysc_node *plVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  ly_ctx *plVar8;
  
  set_00 = *args;
  if ((options & 0x1c) == 0) {
    LVar2 = lyxp_set_cast(set_00,LYXP_SET_STRING);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    LVar2 = lyxp_set_cast(args[1],LYXP_SET_STRING);
    if (LVar2 == LY_SUCCESS) {
      pcVar4 = (args[1]->val).str;
      pcVar7 = strstr(((*args)->val).str,pcVar4);
      if (pcVar7 != (char *)0x0) {
        sVar5 = strlen(pcVar4);
        sVar6 = strlen(pcVar7 + sVar5);
        set_fill_string(set,pcVar7 + sVar5,(uint32_t)sVar6);
        return LY_SUCCESS;
      }
      set_fill_string(set,"",0);
      return LY_SUCCESS;
    }
    return LVar2;
  }
  if ((set_00->type == LYXP_SET_SCNODE_SET) &&
     (plVar3 = warn_get_scnode_in_ctx(set_00), plVar3 != (lysc_node *)0x0)) {
    if ((plVar3->nodetype & 0xc) == 0) {
      plVar8 = set->ctx;
      pcVar4 = lys_nodetype2str(plVar3->nodetype);
      pcVar7 = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      lVar1 = warn_is_string_type((lysc_type *)plVar3[1].parent);
      if (lVar1 != '\0') goto LAB_001a7da6;
      plVar8 = set->ctx;
      pcVar4 = plVar3->name;
      pcVar7 = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
    ly_log(plVar8,LY_LLWRN,LY_SUCCESS,pcVar7,"xpath_substring_after",pcVar4);
  }
LAB_001a7da6:
  if ((args[1]->type == LYXP_SET_SCNODE_SET) &&
     (plVar3 = warn_get_scnode_in_ctx(args[1]), plVar3 != (lysc_node *)0x0)) {
    if ((plVar3->nodetype & 0xc) == 0) {
      plVar8 = set->ctx;
      pcVar4 = lys_nodetype2str(plVar3->nodetype);
      pcVar7 = "Argument #2 of %s is a %s node \"%s\".";
    }
    else {
      lVar1 = warn_is_string_type((lysc_type *)plVar3[1].parent);
      if (lVar1 != '\0') goto LAB_001a7e21;
      plVar8 = set->ctx;
      pcVar4 = plVar3->name;
      pcVar7 = "Argument #2 of %s is node \"%s\", not of string-type.";
    }
    ly_log(plVar8,LY_LLWRN,LY_SUCCESS,pcVar7,"xpath_substring_after",pcVar4);
  }
LAB_001a7e21:
  set_scnode_clear_ctx(set,1);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_substring_after(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    char *ptr;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);
    rc = lyxp_set_cast(args[1], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    ptr = strstr(args[0]->val.str, args[1]->val.str);
    if (ptr) {
        set_fill_string(set, ptr + strlen(args[1]->val.str), strlen(ptr + strlen(args[1]->val.str)));
    } else {
        set_fill_string(set, "", 0);
    }

    return LY_SUCCESS;
}